

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O3

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMacroHelperCommand *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer pbVar7;
  long *plVar8;
  long lVar9;
  cmExecutionStatus *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  pointer pcVar16;
  pointer pcVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmExecutionStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  cmListFileFunction newLFF;
  MacroPushPop macroScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  string expandedArgv;
  string expandedArgn;
  string argcDef;
  ostringstream argcDefStream;
  char argvName [60];
  undefined1 local_3b8 [16];
  pointer local_3a8;
  string local_398;
  cmExecutionStatus *local_378;
  cmMacroHelperCommand *local_370;
  pointer local_368;
  cmListFileArgument local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  undefined1 local_2f8 [32];
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  pointer local_288;
  pointer local_280;
  MacroPushPop local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0 [3];
  ios_base local_180 [264];
  char local_78 [72];
  
  local_3b8 = (undefined1  [16])0x0;
  local_3a8 = (pointer)0x0;
  cmMakefile::ExpandArguments
            ((this->super_cmCommand).Makefile,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3b8,(char *)0x0);
  if ((ulong)((long)(local_3b8._8_8_ - local_3b8._0_8_) >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"Macro invoked with incorrect arguments for macro named: ","");
    std::__cxx11::string::_M_append
              ((char *)local_1f0,
               (ulong)(((this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    cmCommand::SetError(&this->super_cmCommand,local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,local_1f0[0].field_2._M_allocated_capacity + 1);
    }
    bVar13 = 0;
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              (&local_278,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1f0);
    std::__cxx11::stringbuf::str();
    local_2f8._0_8_ =
         local_3b8._0_8_ +
         (long)(this->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
         (-0x20 - (long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_2f8._8_8_ = local_3b8._8_8_;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_230,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_2f8,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_250,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3b8,";");
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_378 = inStatus;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_318,
              ((long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    pbVar7 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_370 = this;
    if (0x20 < (ulong)((long)(this->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7)) {
      uVar12 = 1;
      uVar14 = 2;
      do {
        std::operator+(&local_360.Value,"${",pbVar7 + uVar12);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_360);
        local_2f8._0_8_ = local_2f8 + 0x10;
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8 == pbVar11)
        {
          local_2f8._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_2f8._24_8_ = plVar8[3];
        }
        else {
          local_2f8._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_2f8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
        }
        local_2f8._8_8_ = plVar8[1];
        *plVar8 = (long)pbVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2f8 + 0x10))
        {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360.Value._M_dataplus._M_p != &local_360.Value.field_2) {
          operator_delete(local_360.Value._M_dataplus._M_p,
                          CONCAT71(local_360.Value.field_2._M_allocated_capacity._1_7_,
                                   local_360.Value.field_2._M_local_buf[0]) + 1);
        }
        pbVar7 = (local_370->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar6 = uVar14 < (ulong)((long)(local_370->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >>
                                5);
        uVar12 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar6);
    }
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_268,(long)(local_3b8._8_8_ - local_3b8._0_8_) >> 5);
    pcVar3 = local_370;
    if (local_3b8._8_8_ != local_3b8._0_8_) {
      uVar12 = 0;
      do {
        sprintf(local_78,"${ARGV%u}",uVar12);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[60]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                   (char (*) [60])local_78);
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (uVar12 < (ulong)((long)(local_3b8._8_8_ - local_3b8._0_8_) >> 5));
    }
    local_2d8._M_p = (pointer)&local_2c8;
    local_2f8._0_8_ = local_2f8 + 0x10;
    local_2f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2f8._16_8_ = local_2f8._16_8_ & 0xffffffffffffff00;
    local_2d0 = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b8 = (undefined1  [16])0x0;
    local_2a8 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    local_288 = (pointer)0x0;
    pcVar17 = (pcVar3->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_280 = (pcVar3->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (pcVar17 == local_280) {
      bVar13 = 1;
    }
    else {
      paVar1 = &local_398.field_2;
      do {
        uVar4 = local_298._0_8_;
        uVar5 = local_298._8_8_;
        local_368 = pcVar17;
        if (local_298._8_8_ != local_298._0_8_) {
          paVar15 = &((string *)local_298._0_8_)->field_2;
          do {
            plVar8 = (long *)(((string *)(paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar8) {
              operator_delete(plVar8,paVar15->_M_allocated_capacity + 1);
            }
            pcVar16 = (pointer)((long)paVar15 + 0x38);
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar15 + 0x48);
          } while (pcVar16 != (pointer)uVar5);
          local_298._8_8_ = uVar4;
        }
        pcVar17 = local_368;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_298,
                   ((long)(local_368->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_368->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
        std::__cxx11::string::_M_assign((string *)local_2f8);
        std::__cxx11::string::_M_assign((string *)(local_2f8 + 0x20));
        local_2b8._0_8_ = (pcVar17->super_cmCommandContext).Line;
        pcVar2 = (pcVar17->Arguments).
                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pcVar16 = (pcVar17->Arguments).
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start; pcVar16 != pcVar2;
            pcVar16 = pcVar16 + 1) {
          local_360.Value._M_dataplus._M_p = (pointer)&local_360.Value.field_2;
          local_360.Value._M_string_length = 0;
          local_360.Value.field_2._M_local_buf[0] = '\0';
          local_360.Delim = Unquoted;
          local_360.Line = 0;
          local_360.Col._0_4_ = 0xffffffff;
          local_360.Col._4_4_ = 0xffffffff;
          local_360.LineEnd._0_4_ = 0xffffffff;
          local_360.LineEnd._4_4_ = 0xffffffff;
          local_360.ColEnd = -1;
          std::__cxx11::string::_M_assign((string *)&local_360);
          if (pcVar16->Delim != Bracket) {
            if (local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar12 = 0;
              uVar14 = 1;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_360.Value,
                           local_318.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12,
                           (string *)(local_3b8._0_8_ + uVar12 * 0x20));
                bVar6 = uVar14 < (ulong)((long)local_318.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_318.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar12 = uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (bVar6);
            }
            local_398._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"${ARGC}","");
            cmsys::SystemTools::ReplaceString(&local_360.Value,&local_398,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != paVar1) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
            local_398._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"${ARGN}","");
            cmsys::SystemTools::ReplaceString(&local_360.Value,&local_398,&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != paVar1) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
            local_398._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"${ARGV}","");
            cmsys::SystemTools::ReplaceString(&local_360.Value,&local_398,&local_250);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != paVar1) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
            lVar9 = std::__cxx11::string::find((char *)&local_360,0x5534db,0);
            if (lVar9 != -1) {
              if (local_3b8._8_8_ != local_3b8._0_8_) {
                uVar12 = 0;
                uVar14 = 1;
                do {
                  cmsys::SystemTools::ReplaceString
                            (&local_360.Value,
                             local_268.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar12,
                             (string *)(local_3b8._0_8_ + uVar12 * 0x20));
                  bVar6 = uVar14 < (ulong)((long)(local_3b8._8_8_ - local_3b8._0_8_) >> 5);
                  uVar12 = uVar14;
                  uVar14 = (ulong)((int)uVar14 + 1);
                } while (bVar6);
              }
            }
          }
          local_360.Delim = pcVar16->Delim;
          local_360.Line = pcVar16->Line;
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
          emplace_back<cmListFileArgument>
                    ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_298,
                     &local_360);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360.Value._M_dataplus._M_p != &local_360.Value.field_2) {
            operator_delete(local_360.Value._M_dataplus._M_p,
                            CONCAT71(local_360.Value.field_2._M_allocated_capacity._1_7_,
                                     local_360.Value.field_2._M_local_buf[0]) + 1);
          }
        }
        local_360.Value._M_dataplus._M_p = local_360.Value._M_dataplus._M_p & 0xffffffff00000000;
        bVar6 = cmMakefile::ExecuteCommand
                          ((local_370->super_cmCommand).Makefile,(cmListFileFunction *)local_2f8,
                           (cmExecutionStatus *)&local_360);
        if ((!bVar6) || (local_360.Value._M_dataplus._M_p._3_1_ == '\x01')) {
          local_278.ReportError = false;
          pcVar17 = (pointer)0x0;
          pcVar10 = (cmExecutionStatus *)&local_378->NestedError;
LAB_0028717b:
          pcVar10->ReturnInvoked = true;
          bVar13 = 0;
          goto LAB_00287190;
        }
        pcVar17 = (pointer)0x1;
        pcVar10 = local_378;
        if ((char)local_360.Value._M_dataplus._M_p != '\0') goto LAB_0028717b;
        if (local_360.Value._M_dataplus._M_p._1_1_ == '\x01') {
          pcVar10 = (cmExecutionStatus *)&local_378->BreakInvoked;
          goto LAB_0028717b;
        }
        pcVar17 = local_368 + 1;
      } while (pcVar17 != local_280);
      bVar13 = 1;
    }
LAB_00287190:
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2f8 + 0x10)) {
      operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    bVar13 = bVar13 | (byte)pcVar17;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
    cmMakefile::MacroPushPop::~MacroPushPop(&local_278);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3b8);
  return (bool)(bVar13 & 1);
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus& inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
  }

  cmMakefile::MacroPushPop macroScope(this->Makefile, this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit =
    expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j) {
    variables.push_back("${" + this->Args[j] + "}");
  }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j) {
    sprintf(argvName, "${ARGV%u}", j);
    argVs.emplace_back(argvName);
  }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for (cmListFileFunction const& func : this->Functions) {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(func.Arguments.size());
    newLFF.Name = func.Name;
    newLFF.Line = func.Line;

    // for each argument of the current function
    for (cmListFileArgument const& k : func.Arguments) {
      cmListFileArgument arg;
      arg.Value = k.Value;
      if (k.Delim != cmListFileArgument::Bracket) {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j) {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
        }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos) {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t) {
            cmSystemTools::ReplaceString(arg.Value, argVs[t], expandedArgs[t]);
          }
        }
      }
      arg.Delim = k.Delim;
      arg.Line = k.Line;
      newLFF.Arguments.push_back(std::move(arg));
    }
    cmExecutionStatus status;
    if (!this->Makefile->ExecuteCommand(newLFF, status) ||
        status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked();
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
  }
  return true;
}